

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

FFSEncodeVector copy_all_to_FFSBuffer(FFSBuffer buf,FFSEncodeVector vec)

{
  long lVar1;
  void *__ptr;
  ssize_t sVar2;
  long lVar3;
  FFSEncodeVector pFVar4;
  long in_RSI;
  ulong *in_RDI;
  char *data;
  ssize_t offset;
  FFSEncodeVector v;
  size_t *already_in;
  int vec_count;
  intptr_t vec_offset;
  int i;
  size_t in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar5;
  int local_14;
  
  local_14 = 0;
  lVar1 = in_RSI - *in_RDI;
  iVar5 = 0;
  while (*(long *)(in_RSI + (long)iVar5 * 0x10) != 0) {
    iVar5 = iVar5 + 1;
  }
  __ptr = ffs_malloc(in_stack_ffffffffffffffc0);
  while (*(long *)(in_RSI + (long)local_14 * 0x10) != 0) {
    if ((*(ulong *)(in_RSI + (long)local_14 * 0x10) < *in_RDI) ||
       (*in_RDI + in_RDI[1] <= *(ulong *)(in_RSI + (long)local_14 * 0x10))) {
      *(undefined8 *)((long)__ptr + (long)local_14 * 8) = 0;
    }
    else {
      *(ulong *)(in_RSI + (long)local_14 * 0x10) =
           (*(long *)(in_RSI + (long)local_14 * 0x10) - *in_RDI) + 1;
      *(undefined8 *)((long)__ptr + (long)local_14 * 8) = 1;
    }
    local_14 = local_14 + 1;
  }
  local_14 = 0;
  while (*(long *)(*in_RDI + lVar1 + (long)local_14 * 0x10) != 0) {
    if (*(long *)((long)__ptr + (long)local_14 * 8) == 0) {
      sVar2 = add_to_tmp_buffer((FFSBuffer)CONCAT44(iVar5,in_stack_ffffffffffffffd8),(size_t)__ptr);
      lVar3 = *in_RDI + lVar1;
      memcpy((void *)(*in_RDI + sVar2),*(void **)(lVar3 + (long)local_14 * 0x10),
             *(size_t *)(lVar3 + (long)local_14 * 0x10 + 8));
      *(ssize_t *)(lVar3 + (long)local_14 * 0x10) = sVar2 + 1;
    }
    local_14 = local_14 + 1;
  }
  free(__ptr);
  pFVar4 = (FFSEncodeVector)(*in_RDI + lVar1);
  local_14 = 0;
  while (pFVar4[local_14].iov_base != (void *)0x0) {
    if ((0 < (long)pFVar4[local_14].iov_base) && (pFVar4[local_14].iov_base <= (void *)in_RDI[1])) {
      pFVar4[local_14].iov_base = (void *)((long)pFVar4[local_14].iov_base + (*in_RDI - 1));
    }
    local_14 = local_14 + 1;
  }
  return pFVar4;
}

Assistant:

extern FFSEncodeVector
copy_all_to_FFSBuffer(FFSBuffer buf, FFSEncodeVector vec)
{
    int i = 0;
    intptr_t vec_offset = (intptr_t) vec - (intptr_t)buf->tmp_buffer;
    /* 
     * vec and some of the buffers may be in the memory managed by the
     * FFSBuffer.  The goal here to is put *everything* into the FFSBuffer.
     */
    int vec_count = 0;
    while (vec[vec_count].iov_base != NULL) {
      vec_count++;
    }
    assert(((uintptr_t)vec >= (uintptr_t)buf->tmp_buffer) && 
	   ((uintptr_t)vec < (uintptr_t)buf->tmp_buffer + buf->tmp_buffer_size));
    {
	size_t* already_in = malloc(sizeof(already_in[0]) * vec_count);
	while (vec[i].iov_base != NULL) {
	    if (((char*)vec[i].iov_base >= (char*)buf->tmp_buffer) &&
		((char*)vec[i].iov_base < (char*)buf->tmp_buffer + buf->tmp_buffer_size)) {
	        /* 
		 * remap pointers into temp so that they're offsets (must do
		 * this before we realloc the temp
		 */ 
	        vec[i].iov_base = (void*)((char *)vec[i].iov_base - (char *)buf->tmp_buffer + 1);
		already_in[i] = 1;
	    } else {
		already_in[i] = 0;
	    }
	    i++;
	}

	i = 0;
	while (((FFSEncodeVector)((intptr_t)buf->tmp_buffer + vec_offset))[i].iov_base !=
	       NULL) {
	    FFSEncodeVector v = (void*)((intptr_t) buf->tmp_buffer + vec_offset);
	    if (already_in[i] == 0) {
	        /* if this is an external buffer, copy it */
	        ssize_t offset = add_to_tmp_buffer(buf, v[i].iov_len);
		char * data = (char *) buf->tmp_buffer + offset;
		/* add_to_tmp_buffer() might have remapped vector */
		v = (void*)((char *) buf->tmp_buffer + vec_offset);
		memcpy(data, v[i].iov_base, v[i].iov_len);
		v[i].iov_base = (void*)(intptr_t)(offset + 1);
	    }
	    i++;
	}
	free(already_in);
    }
    /* reallocation done now */
    vec = (void*)((intptr_t)buf->tmp_buffer + vec_offset);
    i = 0;
    while (vec[i].iov_base != NULL) {
	if (((intptr_t)vec[i].iov_base > 0) &&
	    ((uintptr_t)vec[i].iov_base <= (uintptr_t)buf->tmp_buffer_size)) {
	    /* 
	     * remap pointers into temp so that they're addresses
	     */ 
	    vec[i].iov_base = (void*)((intptr_t)vec[i].iov_base + (char *)buf->tmp_buffer - 1);
	}
	i++;
    }
    return vec;
}